

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSimplexAnalysis.cpp
# Opt level: O1

void __thiscall
HighsSimplexAnalysis::userInvertReport(HighsSimplexAnalysis *this,bool header,bool force)

{
  basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar1;
  stringstream *this_00;
  size_t in_RCX;
  undefined7 in_register_00000011;
  double dVar2;
  double extraout_XMM0_Qa;
  undefined1 *local_40;
  undefined1 local_30 [16];
  
  if (this->timeless_log == true) {
    dVar2 = this->highs_run_time + 1.0;
  }
  else {
    HighsTimer::read(this->timer_,0,(void *)CONCAT71(in_register_00000011,force),in_RCX);
    dVar2 = extraout_XMM0_Qa;
  }
  this->highs_run_time = dVar2;
  if ((force) || (this->last_user_log_time + this->delta_user_log_time <= dVar2)) {
    this_00 = (stringstream *)operator_new(0x188);
    std::__cxx11::stringstream::stringstream(this_00);
    pbVar1 = (this->analysis_log)._M_t.
             super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             .
             super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
             ._M_head_impl;
    (this->analysis_log)._M_t.
    super___uniq_ptr_impl<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    .
    super__Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
    ._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)this_00;
    if (pbVar1 != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      (**(code **)(*(long *)pbVar1 + 8))();
    }
    reportIterationObjective(this,header);
    reportInfeasibility(this,header);
    if (this->timeless_log == false) {
      reportRunTime(this,header,this->highs_run_time);
    }
    std::__cxx11::stringbuf::str();
    highsLogUser(&this->log_options,kInfo,"%s\n",local_40);
    if (local_40 != local_30) {
      operator_delete(local_40);
    }
    if (!header) {
      this->last_user_log_time = this->highs_run_time;
    }
    if (this->delta_user_log_time * 200.0 < this->highs_run_time) {
      this->delta_user_log_time = this->delta_user_log_time * 10.0;
    }
  }
  return;
}

Assistant:

void HighsSimplexAnalysis::userInvertReport(const bool header,
                                            const bool force) {
  highs_run_time = timeless_log ? highs_run_time + 1 : timer_->read();
  if (!force && highs_run_time < last_user_log_time + delta_user_log_time)
    return;
  analysis_log = std::unique_ptr<std::stringstream>(new std::stringstream());
  reportIterationObjective(header);
  reportInfeasibility(header);
  if (!timeless_log) reportRunTime(header, highs_run_time);
  highsLogUser(log_options, HighsLogType::kInfo, "%s\n",
               analysis_log->str().c_str());
  if (!header) last_user_log_time = highs_run_time;
  if (highs_run_time > 200 * delta_user_log_time) delta_user_log_time *= 10;
}